

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,TernaryExpr *expr)

{
  Enum EVar1;
  Newline local_81;
  Type local_80;
  StackVar local_78;
  Type local_6c;
  StackVar local_64;
  Type local_58;
  StackVar local_50;
  Type local_44;
  StackVar local_3c;
  Type local_30;
  Type result_type;
  TernaryExpr *expr_local;
  CWriter *this_local;
  
  result_type = (Type)expr;
  EVar1 = Opcode::operator_cast_to_Enum(&expr->opcode);
  if (EVar1 == V128BitSelect) {
    local_44 = Opcode::GetResultType((Opcode *)((long)result_type + 0x3c));
    local_30 = local_44;
    StackVar::StackVar(&local_3c,2,local_44);
    Type::Type(&local_58,Any);
    StackVar::StackVar(&local_50,2,local_58);
    Type::Type(&local_6c,Any);
    StackVar::StackVar(&local_64,1,local_6c);
    Type::Type(&local_80,Any);
    StackVar::StackVar(&local_78,0,local_80);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],char_const(&)[26],char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,&local_3c,(char (*) [4])0x239347,
               (char (*) [26])"simde_wasm_v128_bitselect",(char (*) [2])0x239ca8,&local_50,
               (char (*) [3])0x23cd10,&local_64,(char (*) [3])0x23cd10,&local_78,
               (char (*) [3])0x239d95,&local_81);
    DropTypes(this,3);
    PushType(this,local_30);
    return;
  }
  abort();
}

Assistant:

void CWriter::Write(const TernaryExpr& expr) {
  switch (expr.opcode) {
    case Opcode::V128BitSelect: {
      Type result_type = expr.opcode.GetResultType();
      Write(StackVar(2, result_type), " = ", "simde_wasm_v128_bitselect", "(",
            StackVar(2), ", ", StackVar(1), ", ", StackVar(0), ");", Newline());
      DropTypes(3);
      PushType(result_type);
      break;
    }
    default:
      WABT_UNREACHABLE;
  }
}